

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  undefined1 auVar1 [64];
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  stbi_uc *psVar11;
  long lVar12;
  stbi__uint16 *psVar13;
  undefined1 auVar14 [64];
  undefined1 in_ZMM0 [64];
  
  lVar5 = 0;
  iVar6 = 0;
  do {
    if (0 < count[lVar5]) {
      lVar12 = 0;
      do {
        h->size[lVar12 + iVar6] = (char)lVar5 + '\x01';
        lVar12 = lVar12 + 1;
      } while ((int)lVar12 < count[lVar5]);
      iVar6 = iVar6 + (int)lVar12;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  uVar7 = 1;
  uVar9 = 0;
  uVar4 = 0;
  h->size[iVar6] = '\0';
  do {
    h->delta[uVar7] = uVar4 - uVar9;
    if (uVar7 == h->size[(int)uVar4]) {
      psVar13 = h->code + (int)uVar4;
      psVar11 = h->size + (long)(int)uVar4 + 1;
      do {
        uVar10 = uVar9;
        *psVar13 = (stbi__uint16)uVar10;
        uVar9 = uVar10 + 1;
        psVar13 = psVar13 + 1;
        uVar4 = uVar4 + 1;
        bVar2 = *psVar11;
        psVar11 = psVar11 + 1;
      } while (uVar7 == bVar2);
      if (uVar10 >> ((uint)uVar7 & 0x1f) != 0) {
        stbi__g_failure_reason = "bad code lengths";
        return 0;
      }
    }
    uVar10 = uVar9 << ((byte)(0x10 - (char)uVar7) & 0x1f);
    uVar9 = uVar9 * 2;
    h->maxcode[uVar7] = uVar10;
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x11) {
      auVar14 = vpternlogd_avx512f(in_ZMM0,in_ZMM0,in_ZMM0,0xff);
      h->maxcode[0x11] = 0xffffffff;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])h->fast = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x40) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x80) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0xc0) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x100) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x140) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x180) = auVar1;
      auVar1 = vmovdqu64_avx512f(auVar14);
      *(undefined1 (*) [64])(h->fast + 0x1c0) = auVar1;
      if (0 < (int)uVar4) {
        uVar7 = 0;
        do {
          if ((ulong)h->size[uVar7] < 10) {
            uVar3 = h->code[uVar7];
            uVar8 = 9 - (ulong)h->size[uVar7];
            lVar5 = 0;
            do {
              h->fast[lVar5 + ((ulong)uVar3 << (uVar8 & 0x3f))] = (stbi_uc)uVar7;
              lVar5 = lVar5 + 1;
            } while ((uint)lVar5 >> ((uint)uVar8 & 0x1f) == 0);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar4);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}